

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hydro_ebmol.cpp
# Opt level: O1

void EBMOL::ComputeSyncAofs
               (MultiFab *aofs,int aofs_comp,int ncomp,MultiFab *state,int state_comp,MultiFab *umac
               ,MultiFab *vmac,MultiFab *wmac,MultiFab *ucorr,MultiFab *vcorr,MultiFab *wcorr,
               MultiFab *xedge,MultiFab *yedge,MultiFab *zedge,int edge_comp,bool known_edgestate,
               MultiFab *xfluxes,MultiFab *yfluxes,MultiFab *zfluxes,int fluxes_comp,
               Vector<amrex::BCRec,_std::allocator<amrex::BCRec>_> *bcs,BCRec *d_bcrec_ptr,
               Geometry *geom,Real dt,bool is_velocity,string redistribution_type)

{
  BoxArray *bxs;
  DistributionMapping *dm;
  Box *pBVar1;
  EBCellFlagFab *pEVar2;
  string redistribution_type_00;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  uint uVar5;
  FabType FVar6;
  int iVar7;
  int iVar8;
  long lVar9;
  FabFactory<amrex::FArrayBox> *pFVar10;
  ulong uVar11;
  FabArray<amrex::EBCellFlagFab> *pFVar12;
  MultiCutFab *pMVar13;
  FabArray<amrex::FArrayBox> *pFVar14;
  ulong uVar15;
  Arena *arena;
  IntVect *pIVar16;
  Dim3 *pDVar17;
  undefined4 in_register_00000014;
  int iVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  long lVar22;
  long lVar23;
  double **ppdVar24;
  long lVar25;
  int iVar26;
  long lVar27;
  long lVar28;
  int iVar29;
  ulong uVar30;
  long lVar31;
  long lVar32;
  bool bVar33;
  int iVar35;
  int iVar36;
  undefined1 auVar34 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  int iVar40;
  Periodicity PVar41;
  ulong in_stack_fffffffffffff4a0;
  Array4<const_double> *in_stack_fffffffffffff4a8;
  long local_b50;
  long local_b48;
  long local_b38;
  long local_b30;
  long local_b18;
  Array4<double> fy;
  FabArray<amrex::FArrayBox> *local_ab0;
  Box result;
  int local_a5c;
  int iStack_a58;
  Box local_a3c;
  Array4<const_double> fcy;
  Array4<double> xed;
  Array4<double> fz;
  Array4<double> fx;
  Vector<int,_std::allocator<int>_> *local_918;
  Array4<double> zed;
  Array4<double> yed;
  Array4<const_double> fcz;
  Array4<const_double> apx;
  Box local_72c;
  Box local_710;
  Box local_6f4;
  Array4<const_double> apy;
  Array4<const_double> q;
  long *local_650 [2];
  long local_640 [2];
  Array4<const_double> v;
  Array4<const_double> u;
  Array4<const_double> uc;
  Array4<const_double> fcx_1;
  MFItInfo mfi_info;
  Array4<const_double> vfrac;
  Array4<const_double> apz;
  Array4<const_double> ccc;
  Array4<double> advc_arr;
  Array4<const_double> wc;
  Array4<const_double> vc;
  MultiFab sstate_tmp;
  MultiFab advc;
  Array4<const_double> w;
  
  if ((state->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < state_comp + ncomp) {
    amrex::Assert_host("state.nComp() >= state_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x152,(char *)0x0);
  }
  if ((aofs->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < aofs_comp + ncomp) {
    amrex::Assert_host("aofs.nComp() >= aofs_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x153,(char *)0x0);
  }
  iVar18 = edge_comp + ncomp;
  if ((xedge->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < iVar18) {
    amrex::Assert_host("xedge.nComp() >= edge_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x154,(char *)0x0);
  }
  if ((yedge->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < iVar18) {
    amrex::Assert_host("yedge.nComp() >= edge_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x155,(char *)0x0);
  }
  if ((zedge->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < iVar18) {
    amrex::Assert_host("zedge.nComp() >= edge_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x156,(char *)0x0);
  }
  iVar18 = fluxes_comp + ncomp;
  if ((xfluxes->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < iVar18) {
    amrex::Assert_host("xfluxes.nComp() >= fluxes_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x157,(char *)0x0);
  }
  if ((yfluxes->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < iVar18) {
    amrex::Assert_host("yfluxes.nComp() >= fluxes_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x158,(char *)0x0);
  }
  if ((zfluxes->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_comp < iVar18) {
    amrex::Assert_host("zfluxes.nComp() >= fluxes_comp + ncomp",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x159,(char *)0x0);
  }
  if ((xfluxes->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0] !=
      (xedge->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0]) {
    amrex::Assert_host("xfluxes.nGrow() == xedge.nGrow()",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x15a,(char *)0x0);
  }
  if ((yfluxes->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0] !=
      (yedge->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0]) {
    amrex::Assert_host("yfluxes.nGrow() == yedge.nGrow()",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x15b,(char *)0x0);
  }
  if ((zfluxes->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0] !=
      (zedge->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0]) {
    amrex::Assert_host("zfluxes.nGrow() == zedge.nGrow()",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x15c,(char *)0x0);
  }
  if ((!known_edgestate) &&
     ((state->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0] < 2)) {
    amrex::Assert_host("state.nGrow() >= 2",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x161,(char *)0x0);
  }
  pFVar10 = (state->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
            super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
            ._M_t.
            super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
            .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>._M_head_impl;
  if ((pFVar10 == (FabFactory<amrex::FArrayBox> *)0x0) ||
     (lVar9 = __dynamic_cast(pFVar10,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                             &amrex::EBFArrayBoxFactory::typeinfo), lVar9 == 0)) {
    amrex::Assert_host("state.hasEBFabFactory()",
                       "/workspace/llm4binary/github/license_c_cmakelists/AMReX-Combustion[P]PeleLM/Submodules/AMReX-Hydro/EBMOL/hydro_ebmol.cpp"
                       ,0x163,(char *)0x0);
  }
  pFVar10 = (FabFactory<amrex::FArrayBox> *)
            __dynamic_cast((state->super_FabArray<amrex::FArrayBox>).m_factory._M_t.
                           super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                           .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                           _M_head_impl,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                           &amrex::EBFArrayBoxFactory::typeinfo,0);
  if (pFVar10 == (FabFactory<amrex::FArrayBox> *)0x0) {
    __cxa_bad_cast();
  }
  bxs = &(state->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.boxarray;
  dm = &(state->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.distributionMap;
  sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase._1_7_ = 0;
  sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase._0_1_ = 1;
  sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_bat_type = null;
  sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_indexType.
  m_typ.itype = (BATindexType)(IndexType)0x0;
  sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._4_8_ = 0;
  sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._12_8_ = 0;
  sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
  m_loshft.vect[0] = 0;
  sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
  m_loshft.vect[1] = 0;
  amrex::MultiFab::MultiFab(&advc,bxs,dm,ncomp,3,(MFInfo *)&sstate_tmp,pFVar10);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)&sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
                m_bndryReg.m_typ);
  amrex::FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
            (&advc.super_FabArray<amrex::FArrayBox>,0.0,0,
             advc.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_comp,
             &advc.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.n_grow);
  mfi_info.num_streams = amrex::Gpu::Device::max_gpu_streams;
  mfi_info.do_tiling = true;
  mfi_info.tilesize.vect[0] = (int)amrex::FabArrayBase::mfiter_tile_size;
  mfi_info.tilesize.vect[1] = amrex::FabArrayBase::mfiter_tile_size._4_4_;
  mfi_info.tilesize.vect[2] = DAT_0083cec0;
  mfi_info.dynamic = true;
  mfi_info.device_sync = true;
  amrex::MFIter::MFIter((MFIter *)&sstate_tmp,(FabArrayBase *)aofs,&mfi_info);
  if (sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
      m_loshft.vect[0] <
      sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.m_bndryReg.
      m_loshft.vect[2]) {
    uVar5 = (uint)!known_edgestate;
    iVar18 = uVar5 * 2;
    uVar11 = (ulong)(uint)ncomp;
    do {
      amrex::MFIter::tilebox(&local_a3c,(MFIter *)&sstate_tmp);
      amrex::MFIter::nodaltilebox(&local_6f4,(MFIter *)&sstate_tmp,0);
      amrex::MFIter::nodaltilebox(&local_710,(MFIter *)&sstate_tmp,1);
      amrex::MFIter::nodaltilebox(&local_72c,(MFIter *)&sstate_tmp,2);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&fx,&xfluxes->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp,fluxes_comp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&fy,&yfluxes->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp,fluxes_comp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&fz,&zfluxes->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp,fluxes_comp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&xed,&xedge->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp,edge_comp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&yed,&yedge->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp,edge_comp);
      amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                (&zed,&zedge->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp,edge_comp);
      pFVar12 = amrex::EBDataCollection::getMultiEBCellFlagFab
                          ((EBDataCollection *)pFVar10[0x1b]._vptr_FabFactory);
      pIVar16 = &sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
                 m_bndryReg.m_loshft;
      if (sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op._52_8_
          != 0) {
        pIVar16 = (IntVect *)
                  ((long)sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.
                         m_bat.m_op.m_bndryReg.m_loshft.vect[0] * 4 +
                  *(long *)sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.
                           m_bat.m_op._52_8_);
      }
      pEVar2 = (pFVar12->m_fabs_v).
               super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>.
               _M_impl.super__Vector_impl_data._M_start[pIVar16->vect[0]];
      fcx_1.p = (double *)(pEVar2->super_BaseFab<amrex::EBCellFlag>).dptr;
      fcx_1.ncomp = (pEVar2->super_BaseFab<amrex::EBCellFlag>).nvar;
      pBVar1 = &(pEVar2->super_BaseFab<amrex::EBCellFlag>).domain;
      fcx_1.begin.z = (pEVar2->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
      fcx_1.begin.x = (pBVar1->smallend).vect[0];
      fcx_1.begin.y = (pBVar1->smallend).vect[1];
      lVar9 = (long)(pEVar2->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] + 1;
      lVar23 = (long)(pEVar2->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0];
      lVar27 = (long)(pEVar2->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[2] + 1;
      fcx_1.jstride = (lVar23 - (pBVar1->smallend).vect[0]) + 1;
      fcx_1.kstride =
           (lVar9 - (pEVar2->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1]) *
           fcx_1.jstride;
      fcx_1.nstride = (lVar27 - fcx_1.begin.z) * fcx_1.kstride;
      fcx_1.end._0_8_ = lVar23 + 1U & 0xffffffff | lVar9 << 0x20;
      fcx_1.end.z = (int)lVar27;
      FVar6 = amrex::EBCellFlagFab::getType(pEVar2,&local_a3c);
      if (FVar6 == covered) {
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  ((Array4<double> *)&uc,&aofs->super_FabArray<amrex::FArrayBox>,
                   (MFIter *)&sstate_tmp,aofs_comp);
        auVar4 = _DAT_0077bb40;
        auVar3 = _DAT_0077bb30;
        if (0 < ncomp) {
          in_stack_fffffffffffff4a8 =
               (Array4<const_double> *)
               CONCAT44((int)((ulong)in_stack_fffffffffffff4a8 >> 0x20),local_a3c.bigend.vect[2]);
          in_stack_fffffffffffff4a0 = (ulong)local_a3c.smallend.vect[1];
          uVar19 = local_a3c.bigend.vect[0] - local_a3c.smallend.vect[0];
          auVar39._4_4_ = 0;
          auVar39._0_4_ = uVar19;
          auVar39._8_4_ = uVar19;
          auVar39._12_4_ = 0;
          local_b50 = (long)uc.p +
                      (in_stack_fffffffffffff4a0 - (long)uc.begin.y) * uc.jstride * 8 +
                      (long)local_a3c.smallend.vect[0] * 8 + (long)uc.begin.x * -8 + 8;
          auVar39 = auVar39 ^ _DAT_0077bb40;
          uVar30 = 0;
          do {
            iVar7 = local_a3c.smallend.vect[2];
            if (local_a3c.smallend.vect[2] <= local_a3c.bigend.vect[2]) {
              do {
                if (local_a3c.smallend.vect[1] <= local_a3c.bigend.vect[1]) {
                  lVar9 = ((long)iVar7 - (long)uc.begin.z) * uc.kstride * 8 + local_b50;
                  uVar15 = in_stack_fffffffffffff4a0;
                  do {
                    if (local_a3c.smallend.vect[0] <= local_a3c.bigend.vect[0]) {
                      uVar21 = 0;
                      do {
                        auVar37._8_4_ = (int)uVar21;
                        auVar37._0_8_ = uVar21;
                        auVar37._12_4_ = (int)(uVar21 >> 0x20);
                        auVar37 = (auVar37 | auVar3) ^ auVar4;
                        bVar33 = auVar39._0_4_ < auVar37._0_4_;
                        iVar35 = auVar39._4_4_;
                        iVar8 = auVar37._4_4_;
                        if ((bool)(~(iVar35 < iVar8 || iVar8 == iVar35 && bVar33) & 1)) {
                          *(undefined8 *)(lVar9 + -8 + uVar21 * 8) = 0x483d6329f1c35ca5;
                        }
                        if (iVar35 >= iVar8 && (iVar8 != iVar35 || !bVar33)) {
                          *(undefined8 *)(lVar9 + uVar21 * 8) = 0x483d6329f1c35ca5;
                        }
                        uVar21 = uVar21 + 2;
                      } while (((ulong)uVar19 + 2 & 0x1fffffffe) != uVar21);
                    }
                    uVar15 = uVar15 + 1;
                    lVar9 = lVar9 + uc.jstride * 8;
                  } while (local_a3c.bigend.vect[1] + 1 != (int)uVar15);
                }
                bVar33 = iVar7 != local_a3c.bigend.vect[2];
                iVar7 = iVar7 + 1;
              } while (bVar33);
            }
            uVar30 = uVar30 + 1;
            local_b50 = local_b50 + uc.nstride * 8;
          } while (uVar30 != uVar11);
        }
        if (0 < ncomp) {
          in_stack_fffffffffffff4a0 = (ulong)(uint)local_6f4.bigend.vect[2];
          lVar9 = (long)local_6f4.smallend.vect[1];
          in_stack_fffffffffffff4a8 = (Array4<const_double> *)(ulong)(uint)local_6f4.bigend.vect[1];
          local_b48 = (long)xed.p +
                      (lVar9 - xed.begin.y) * xed.jstride * 8 + (long)local_6f4.smallend.vect[0] * 8
                      + (long)xed.begin.x * -8;
          local_b18 = CONCAT71(fx.p._1_7_,fx.p._0_1_) +
                      (lVar9 - fx.begin.y) * fx.jstride * 8 + (long)local_6f4.smallend.vect[0] * 8 +
                      (long)fx.begin.x * -8;
          uVar30 = 0;
          do {
            uVar19 = local_6f4.smallend.vect[2];
            if (local_6f4.smallend.vect[2] <= local_6f4.bigend.vect[2]) {
              do {
                if (local_6f4.smallend.vect[1] <= local_6f4.bigend.vect[1]) {
                  lVar28 = ((long)(int)uVar19 - (long)xed.begin.z) * xed.kstride * 8 + local_b48;
                  lVar27 = ((long)(int)uVar19 - (long)fx.begin.z) * fx.kstride * 8 + local_b18;
                  lVar23 = lVar9;
                  do {
                    if (local_6f4.smallend.vect[0] <= local_6f4.bigend.vect[0]) {
                      lVar22 = 0;
                      do {
                        *(undefined8 *)(lVar27 + lVar22 * 8) = 0;
                        *(undefined8 *)(lVar28 + lVar22 * 8) = 0x483d6329f1c35ca5;
                        lVar22 = lVar22 + 1;
                      } while ((local_6f4.bigend.vect[0] - local_6f4.smallend.vect[0]) + 1 !=
                               (int)lVar22);
                    }
                    lVar23 = lVar23 + 1;
                    lVar28 = lVar28 + xed.jstride * 8;
                    lVar27 = lVar27 + fx.jstride * 8;
                  } while (local_6f4.bigend.vect[1] + 1U != (int)lVar23);
                }
                bVar33 = uVar19 != local_6f4.bigend.vect[2];
                uVar19 = uVar19 + 1;
              } while (bVar33);
            }
            uVar30 = uVar30 + 1;
            local_b48 = local_b48 + xed.nstride * 8;
            local_b18 = local_b18 + fx.nstride * 8;
          } while (uVar30 != uVar11);
        }
        if (0 < ncomp) {
          in_stack_fffffffffffff4a8 =
               (Array4<const_double> *)
               CONCAT44((int)((ulong)in_stack_fffffffffffff4a8 >> 0x20),local_710.smallend.vect[2]);
          lVar23 = (long)local_710.smallend.vect[1];
          local_b38 = (long)yed.p +
                      (lVar23 - yed.begin.y) * yed.jstride * 8 +
                      (long)local_710.smallend.vect[0] * 8 + (long)yed.begin.x * -8;
          lVar9 = CONCAT44(fy.jstride._4_4_,(int)fy.jstride) * 8;
          local_b30 = (long)fy.p +
                      (lVar23 - fy.begin.y) * lVar9 + (long)local_710.smallend.vect[0] * 8 +
                      (long)fy.begin.x * -8;
          uVar30 = 0;
          do {
            in_stack_fffffffffffff4a0 = uVar30;
            iVar7 = local_710.smallend.vect[2];
            if (local_710.smallend.vect[2] <= local_710.bigend.vect[2]) {
              do {
                if (local_710.smallend.vect[1] <= local_710.bigend.vect[1]) {
                  lVar22 = ((long)iVar7 - (long)yed.begin.z) * yed.kstride * 8 + local_b38;
                  lVar28 = ((long)iVar7 - (long)fy.begin.z) *
                           CONCAT44(fy.kstride._4_4_,(int)fy.kstride) * 8 + local_b30;
                  lVar27 = lVar23;
                  do {
                    if (local_710.smallend.vect[0] <= local_710.bigend.vect[0]) {
                      lVar25 = 0;
                      do {
                        *(undefined8 *)(lVar28 + lVar25 * 8) = 0;
                        *(undefined8 *)(lVar22 + lVar25 * 8) = 0x483d6329f1c35ca5;
                        lVar25 = lVar25 + 1;
                      } while ((local_710.bigend.vect[0] - local_710.smallend.vect[0]) + 1 !=
                               (int)lVar25);
                    }
                    lVar27 = lVar27 + 1;
                    lVar22 = lVar22 + yed.jstride * 8;
                    lVar28 = lVar28 + lVar9;
                  } while (local_710.bigend.vect[1] + 1 != (int)lVar27);
                }
                bVar33 = iVar7 != local_710.bigend.vect[2];
                iVar7 = iVar7 + 1;
              } while (bVar33);
            }
            local_b38 = local_b38 + yed.nstride * 8;
            local_b30 = local_b30 + CONCAT44(fy.nstride._4_4_,(uint)fy.nstride) * 8;
            uVar30 = in_stack_fffffffffffff4a0 + 1;
          } while (in_stack_fffffffffffff4a0 + 1 != uVar11);
        }
        if (0 < ncomp) {
          lVar9 = (long)local_72c.smallend.vect[1];
          in_stack_fffffffffffff4a0 =
               (lVar9 - zed.begin.y) * zed.jstride * 8 + (long)local_72c.smallend.vect[0] * 8 +
               (long)zed.begin.x * -8 + (long)zed.p;
          in_stack_fffffffffffff4a8 =
               (Array4<const_double> *)
               ((lVar9 - fz.begin.y) * fz.jstride * 8 + (long)local_72c.smallend.vect[0] * 8 +
                (long)fz.begin.x * -8 + (long)fz.p);
          uVar30 = 0;
          do {
            iVar7 = local_72c.smallend.vect[2];
            if (local_72c.smallend.vect[2] <= local_72c.bigend.vect[2]) {
              do {
                if (local_72c.smallend.vect[1] <= local_72c.bigend.vect[1]) {
                  lVar27 = ((long)iVar7 - (long)zed.begin.z) * zed.kstride * 8 +
                           in_stack_fffffffffffff4a0;
                  ppdVar24 = (double **)
                             ((long)&in_stack_fffffffffffff4a8->p +
                             ((long)iVar7 - (long)fz.begin.z) * fz.kstride * 8);
                  lVar23 = lVar9;
                  do {
                    if (local_72c.smallend.vect[0] <= local_72c.bigend.vect[0]) {
                      lVar28 = 0;
                      do {
                        ppdVar24[lVar28] = (double *)0x0;
                        *(undefined8 *)(lVar27 + lVar28 * 8) = 0x483d6329f1c35ca5;
                        lVar28 = lVar28 + 1;
                      } while ((local_72c.bigend.vect[0] - local_72c.smallend.vect[0]) + 1 !=
                               (int)lVar28);
                    }
                    lVar23 = lVar23 + 1;
                    lVar27 = lVar27 + zed.jstride * 8;
                    ppdVar24 = ppdVar24 + fz.jstride;
                  } while (local_72c.bigend.vect[1] + 1 != (int)lVar23);
                }
                bVar33 = iVar7 != local_72c.bigend.vect[2];
                iVar7 = iVar7 + 1;
              } while (bVar33);
            }
            uVar30 = uVar30 + 1;
            in_stack_fffffffffffff4a0 = in_stack_fffffffffffff4a0 + zed.nstride * 8;
            in_stack_fffffffffffff4a8 =
                 (Array4<const_double> *)(&in_stack_fffffffffffff4a8->p + fz.nstride);
          } while (uVar30 != uVar11);
        }
      }
      else {
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&uc,&ucorr->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&vc,&vcorr->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp);
        amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                  (&wc,&wcorr->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp);
        amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&advc_arr,&advc.super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp);
        result.btype.itype = local_a3c.btype.itype;
        result.smallend.vect[0] = local_a3c.smallend.vect[0] + uVar5 * -2;
        result.smallend.vect[1] = local_a3c.smallend.vect[1] + uVar5 * -2;
        result.smallend.vect[2] = local_a3c.smallend.vect[2] + uVar5 * -2;
        result.bigend.vect[0] = local_a3c.bigend.vect[0] + iVar18;
        result.bigend.vect[1] = local_a3c.bigend.vect[1] + iVar18;
        result.bigend.vect[2] = local_a3c.bigend.vect[2] + iVar18;
        FVar6 = amrex::EBCellFlagFab::getType(pEVar2,&result);
        if (FVar6 == regular) {
          if (!known_edgestate) {
            amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      ((Array4<const_double> *)&result,&state->super_FabArray<amrex::FArrayBox>,
                       (MFIter *)&sstate_tmp,state_comp);
            amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&fcy,&umac->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp);
            amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&fcz,&vmac->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp);
            amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&ccc,&wmac->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp);
            MOL::ComputeEdgeState
                      (&local_a3c,&xed,&yed,&zed,(Array4<const_double> *)&result,ncomp,&fcy,&fcz,
                       &ccc,&geom->domain,bcs,d_bcrec_ptr,is_velocity);
          }
          result.smallend.vect[0] = (int)xed.p;
          result.smallend.vect[1] = (int)((ulong)xed.p >> 0x20);
          result.smallend.vect[2] = (int)xed.jstride;
          result.bigend.vect[0] = (int)((ulong)xed.jstride >> 0x20);
          result.bigend.vect[1] = (int)xed.kstride;
          result.bigend.vect[2] = (int)((ulong)xed.kstride >> 0x20);
          result.btype.itype = (uint)xed.nstride;
          fcy.p = yed.p;
          fcy.jstride = yed.jstride;
          fcy.kstride = yed.kstride;
          fcy.nstride = yed.nstride;
          fcy.begin.z = yed.begin.z;
          fcy.end.z = yed.end.z;
          fcy.end.x = yed.end.x;
          fcy.end.y = yed.end.y;
          fcy.ncomp = yed.ncomp;
          fcz.p = zed.p;
          fcz.jstride = zed.jstride;
          fcz.kstride = zed.kstride;
          fcz.nstride = zed.nstride;
          fcz.begin.z = zed.begin.z;
          fcz.end.z = zed.end.z;
          fcz.end.x = zed.end.x;
          fcz.end.y = zed.end.y;
          fcz.ncomp = zed.ncomp;
          HydroUtils::ComputeFluxes
                    (&local_a3c,&fx,&fy,&fz,&uc,&vc,&wc,(Array4<const_double> *)&result,&fcy,&fcz,
                     geom,ncomp,true);
          result.smallend.vect[0] = (int)CONCAT71(fx.p._1_7_,fx.p._0_1_);
          result.smallend.vect[1] = (int)((uint7)fx.p._1_7_ >> 0x18);
          result.smallend.vect[2] = (int)fx.jstride;
          result.bigend.vect[0] = (int)((ulong)fx.jstride >> 0x20);
          result.bigend.vect[1] = (int)fx.kstride;
          result.bigend.vect[2] = (int)((ulong)fx.kstride >> 0x20);
          result.btype.itype = (uint)fx.nstride;
          fcy.p = fy.p;
          fcy.jstride = CONCAT44(fy.jstride._4_4_,(int)fy.jstride);
          fcy.kstride = CONCAT44(fy.kstride._4_4_,(int)fy.kstride);
          fcy.nstride = CONCAT44(fy.nstride._4_4_,(uint)fy.nstride);
          fcy.begin.z = fy.begin.z;
          fcy.end.z = fy.end.z;
          fcy.end.y = fy.end.y;
          fcy.end.x = fy.end.x;
          fcy.ncomp = fy.ncomp;
          fcz.p = fz.p;
          fcz.jstride = fz.jstride;
          fcz.kstride = fz.kstride;
          fcz.nstride = fz.nstride;
          fcz.begin.z = fz.begin.z;
          fcz.begin.x = fz.begin.x;
          fcz.begin.y = fz.begin.y;
          fcz.end.z = fz.end.z;
          fcz.end.x = fz.end.x;
          fcz.end.y = fz.end.y;
          fcz.ncomp = fz.ncomp;
          HydroUtils::ComputeDivergence
                    (&local_a3c,&advc_arr,(Array4<const_double> *)&result,&fcy,&fcz,ncomp,geom,-1.0,
                     true);
        }
        else {
          amrex::EBDataCollection::getFaceCent((EBDataCollection *)pFVar10[0x1b]._vptr_FabFactory);
          amrex::MultiCutFab::const_array
                    ((Array4<const_double> *)&result,(MultiCutFab *)fcy.p,(MFIter *)&sstate_tmp);
          amrex::EBDataCollection::getFaceCent((EBDataCollection *)pFVar10[0x1b]._vptr_FabFactory);
          amrex::MultiCutFab::const_array(&fcy,(MultiCutFab *)fcz.jstride,(MFIter *)&sstate_tmp);
          amrex::EBDataCollection::getFaceCent((EBDataCollection *)pFVar10[0x1b]._vptr_FabFactory);
          amrex::MultiCutFab::const_array(&fcz,(MultiCutFab *)ccc.kstride,(MFIter *)&sstate_tmp);
          pMVar13 = amrex::EBDataCollection::getCentroid
                              ((EBDataCollection *)pFVar10[0x1b]._vptr_FabFactory);
          amrex::MultiCutFab::const_array(&ccc,pMVar13,(MFIter *)&sstate_tmp);
          pFVar14 = &amrex::EBDataCollection::getVolFrac
                               ((EBDataCollection *)pFVar10[0x1b]._vptr_FabFactory)->
                     super_FabArray<amrex::FArrayBox>;
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&vfrac,pFVar14,(MFIter *)&sstate_tmp);
          amrex::EBDataCollection::getAreaFrac((EBDataCollection *)pFVar10[0x1b]._vptr_FabFactory);
          amrex::MultiCutFab::const_array(&apx,(MultiCutFab *)apy.p,(MFIter *)&sstate_tmp);
          amrex::EBDataCollection::getAreaFrac((EBDataCollection *)pFVar10[0x1b]._vptr_FabFactory);
          amrex::MultiCutFab::const_array(&apy,(MultiCutFab *)apz.jstride,(MFIter *)&sstate_tmp);
          amrex::EBDataCollection::getAreaFrac((EBDataCollection *)pFVar10[0x1b]._vptr_FabFactory);
          amrex::MultiCutFab::const_array(&apz,(MultiCutFab *)q.kstride,(MFIter *)&sstate_tmp);
          if (!known_edgestate) {
            amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&q,&state->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp,state_comp)
            ;
            amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&u,&umac->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp);
            amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&v,&vmac->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp);
            amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                      (&w,&wmac->super_FabArray<amrex::FArrayBox>,(MFIter *)&sstate_tmp);
            ComputeEdgeState(&local_a3c,&xed,&yed,&zed,&q,ncomp,&u,&v,&w,&geom->domain,bcs,
                             d_bcrec_ptr,(Array4<const_double> *)&result,&fcy,&fcz,&ccc,&vfrac,
                             (Array4<const_amrex::EBCellFlag> *)&fcx_1,is_velocity);
          }
          q.p = xed.p;
          q.jstride = xed.jstride;
          q.kstride = xed.kstride;
          q.nstride = xed.nstride;
          q.begin.z = xed.begin.z;
          q.end.z = xed.end.z;
          q.end.x = xed.end.x;
          q.end.y = xed.end.y;
          q.ncomp = xed.ncomp;
          u.p = yed.p;
          u.jstride = yed.jstride;
          u.kstride = yed.kstride;
          u.nstride = yed.nstride;
          u.begin.z = yed.begin.z;
          u.end.z = yed.end.z;
          u.end.x = yed.end.x;
          u.end.y = yed.end.y;
          u.ncomp = yed.ncomp;
          v.p = zed.p;
          v.jstride = zed.jstride;
          v.kstride = zed.kstride;
          v.nstride = zed.nstride;
          v.begin.z = zed.begin.z;
          v.end.z = zed.end.z;
          v.end.x = zed.end.x;
          v.end.y = zed.end.y;
          v.ncomp = zed.ncomp;
          HydroUtils::EB_ComputeFluxes
                    (&local_a3c,&fx,&fy,&fz,&uc,&vc,&wc,&q,&u,&v,&apx,&apy,&apz,geom,ncomp,
                     (Array4<const_amrex::EBCellFlag> *)&fcx_1,true);
          q.jstride = fx.jstride;
          q.kstride = fx.kstride;
          q.nstride = fx.nstride;
          q.begin.z = fx.begin.z;
          q.end.z = fx.end.z;
          q.end.x = fx.end.x;
          q.end.y = fx.end.y;
          q.ncomp = fx.ncomp;
          u.p = fy.p;
          u.begin.z = fy.begin.z;
          u.end.z = fy.end.z;
          u.ncomp = fy.ncomp;
          v.p = fz.p;
          v.jstride = fz.jstride;
          v.kstride = fz.kstride;
          v.nstride = fz.nstride;
          v.begin.z = fz.begin.z;
          v.begin.x = fz.begin.x;
          v.begin.y = fz.begin.y;
          v.end.z = fz.end.z;
          v.end.x = fz.end.x;
          v.end.y = fz.end.y;
          v.ncomp = fz.ncomp;
          HydroUtils::EB_ComputeDivergence
                    (&local_a3c,&advc_arr,&q,&u,&v,&vfrac,ncomp,geom,-1.0,true);
        }
      }
      amrex::MFIter::operator++((MFIter *)&sstate_tmp);
    } while (sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
             m_bndryReg.m_loshft.vect[0] <
             sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_op.
             m_bndryReg.m_loshft.vect[2]);
  }
  amrex::MFIter::~MFIter((MFIter *)&sstate_tmp);
  PVar41 = amrex::Geometry::periodicity(geom);
  sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase._0_1_ =
       (undefined1)PVar41.period.vect[0];
  sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase._vptr_FabArrayBase._1_7_ =
       PVar41.period.vect._1_7_;
  sstate_tmp.super_FabArray<amrex::FArrayBox>.super_FabArrayBase.boxarray.m_bat.m_bat_type =
       PVar41.period.vect[2];
  amrex::FabArray<amrex::FArrayBox>::FillBoundary<double>
            (&advc.super_FabArray<amrex::FArrayBox>,(Periodicity *)&sstate_tmp,false);
  amrex::MultiFab::MultiFab(&sstate_tmp);
  iVar18 = std::__cxx11::string::compare(redistribution_type._M_dataplus._M_p);
  local_ab0 = &aofs->super_FabArray<amrex::FArrayBox>;
  if (iVar18 == 0) {
    fx.p._1_7_ = 0;
    fx.p._0_1_ = 1;
    fx.jstride = 0;
    fx.kstride = 0;
    fx.nstride = 0;
    fx.begin.x = 0;
    fx.begin.y = 0;
    local_ab0 = &sstate_tmp.super_FabArray<amrex::FArrayBox>;
    amrex::MultiFab::define
              ((MultiFab *)local_ab0,bxs,dm,ncomp,
               (state->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0],
               (MFInfo *)&fx,pFVar10);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&fx.kstride);
    amrex::MultiFab::Copy
              ((MultiFab *)local_ab0,aofs,aofs_comp,0,ncomp,
               (state->super_FabArray<amrex::FArrayBox>).super_FabArrayBase.n_grow.vect[0]);
  }
  mfi_info.do_tiling = true;
  mfi_info.tilesize.vect[2] = DAT_0083cec0;
  mfi_info.tilesize.vect[0] = (int)amrex::FabArrayBase::mfiter_tile_size;
  mfi_info.tilesize.vect[1] = amrex::FabArrayBase::mfiter_tile_size._4_4_;
  mfi_info.dynamic = true;
  amrex::MFIter::MFIter((MFIter *)&fx,(FabArrayBase *)aofs,&mfi_info);
  if (fx.begin.x < fx.begin.z) {
    iVar18 = ncomp * 2;
    lVar9 = (long)ncomp;
    uVar11 = (ulong)(uint)ncomp;
    do {
      amrex::MFIter::tilebox((Box *)&apx,(MFIter *)&fx);
      pFVar12 = amrex::EBDataCollection::getMultiEBCellFlagFab
                          ((EBDataCollection *)pFVar10[0x1b]._vptr_FabFactory);
      pDVar17 = &fx.begin;
      if (local_918 != (Vector<int,_std::allocator<int>_> *)0x0) {
        pDVar17 = (Dim3 *)((local_918->super_vector<int,_std::allocator<int>_>).
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start + fx.begin.x);
      }
      pEVar2 = (pFVar12->m_fabs_v).
               super__Vector_base<amrex::EBCellFlagFab_*,_std::allocator<amrex::EBCellFlagFab_*>_>.
               _M_impl.super__Vector_impl_data._M_start[pDVar17->x];
      fz.p = (double *)(pEVar2->super_BaseFab<amrex::EBCellFlag>).dptr;
      fz.ncomp = (pEVar2->super_BaseFab<amrex::EBCellFlag>).nvar;
      pBVar1 = &(pEVar2->super_BaseFab<amrex::EBCellFlag>).domain;
      fz.begin.z = (pEVar2->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[2];
      fz.begin.x = (pBVar1->smallend).vect[0];
      fz.begin.y = (pBVar1->smallend).vect[1];
      lVar23 = (long)(pEVar2->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[1] + 1;
      lVar27 = (long)(pEVar2->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[0];
      lVar28 = (long)(pEVar2->super_BaseFab<amrex::EBCellFlag>).domain.bigend.vect[2] + 1;
      fz.jstride = (lVar27 - (pBVar1->smallend).vect[0]) + 1;
      fz.kstride = (lVar23 - (pEVar2->super_BaseFab<amrex::EBCellFlag>).domain.smallend.vect[1]) *
                   fz.jstride;
      fz.nstride = (lVar28 - fz.begin.z) * fz.kstride;
      fz.end._0_8_ = lVar27 + 1U & 0xffffffff | lVar23 << 0x20;
      fz.end.z = (int)lVar28;
      FVar6 = amrex::EBCellFlagFab::getType(pEVar2,(Box *)&apx);
      if (FVar6 != covered) {
        fy.nstride._0_4_ = (uint)apx.nstride;
        fy.jstride._0_4_ = (int)apx.jstride + -4;
        fy.jstride._4_4_ = apx.jstride._4_4_ + 4;
        fy.p = (double *)CONCAT44(apx.p._4_4_ + -4,(int)apx.p + -4);
        fy.kstride._0_4_ = (int)apx.kstride + 4;
        fy.kstride._4_4_ = apx.kstride._4_4_ + 4;
        FVar6 = amrex::EBCellFlagFab::getType(pEVar2,(Box *)&fy);
        if (FVar6 == regular) {
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&fy,&aofs->super_FabArray<amrex::FArrayBox>,(MFIter *)&fx,aofs_comp);
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    (&xed,&advc.super_FabArray<amrex::FArrayBox>,(MFIter *)&fx);
          if (0 < ncomp) {
            lVar27 = (long)apx.p._4_4_;
            lVar23 = CONCAT44(fy.jstride._4_4_,(int)fy.jstride) * 8;
            in_stack_fffffffffffff4a0 =
                 (lVar27 - fy.begin.y) * lVar23 + (long)(int)apx.p * 8 + (long)fy.begin.x * -8 +
                 (long)fy.p;
            lVar28 = (lVar27 - xed.begin.y) * xed.jstride * 8 + (long)(int)apx.p * 8 +
                     (long)xed.begin.x * -8 + (long)xed.p;
            in_stack_fffffffffffff4a8 = (Array4<const_double> *)(xed.kstride * 8);
            uVar30 = 0;
            do {
              iVar7 = (int)apx.jstride;
              if ((int)apx.jstride <= apx.kstride._4_4_) {
                do {
                  if (apx.p._4_4_ <= (int)apx.kstride) {
                    lVar32 = ((long)iVar7 - (long)fy.begin.z) *
                             CONCAT44(fy.kstride._4_4_,(int)fy.kstride) * 8 +
                             in_stack_fffffffffffff4a0;
                    lVar25 = ((long)iVar7 - (long)xed.begin.z) * (long)in_stack_fffffffffffff4a8 +
                             lVar28;
                    lVar22 = lVar27;
                    do {
                      if ((int)apx.p <= apx.jstride._4_4_) {
                        lVar31 = 0;
                        do {
                          *(double *)(lVar32 + lVar31 * 8) =
                               *(double *)(lVar32 + lVar31 * 8) - *(double *)(lVar25 + lVar31 * 8);
                          lVar31 = lVar31 + 1;
                        } while ((apx.jstride._4_4_ - (int)apx.p) + 1 != (int)lVar31);
                      }
                      lVar22 = lVar22 + 1;
                      lVar32 = lVar32 + lVar23;
                      lVar25 = lVar25 + xed.jstride * 8;
                    } while ((int)apx.kstride + 1 != (int)lVar22);
                  }
                  bVar33 = iVar7 != apx.kstride._4_4_;
                  iVar7 = iVar7 + 1;
                } while (bVar33);
              }
              uVar30 = uVar30 + 1;
              in_stack_fffffffffffff4a0 =
                   in_stack_fffffffffffff4a0 + CONCAT44(fy.nstride._4_4_,(uint)fy.nstride) * 8;
              lVar28 = lVar28 + xed.nstride * 8;
            } while (uVar30 != uVar11);
          }
        }
        else {
          amrex::EBDataCollection::getAreaFrac((EBDataCollection *)pFVar10[0x1b]._vptr_FabFactory);
          amrex::MultiCutFab::const_array
                    ((Array4<const_double> *)&xed,(MultiCutFab *)fy.p,(MFIter *)&fx);
          amrex::EBDataCollection::getAreaFrac((EBDataCollection *)pFVar10[0x1b]._vptr_FabFactory);
          amrex::MultiCutFab::const_array
                    ((Array4<const_double> *)&yed,
                     (MultiCutFab *)CONCAT44(fy.jstride._4_4_,(int)fy.jstride),(MFIter *)&fx);
          amrex::EBDataCollection::getAreaFrac((EBDataCollection *)pFVar10[0x1b]._vptr_FabFactory);
          amrex::MultiCutFab::const_array
                    ((Array4<const_double> *)&zed,
                     (MultiCutFab *)CONCAT44(fy.kstride._4_4_,(int)fy.kstride),(MFIter *)&fx);
          amrex::EBDataCollection::getFaceCent((EBDataCollection *)pFVar10[0x1b]._vptr_FabFactory);
          amrex::MultiCutFab::const_array(&fcx_1,(MultiCutFab *)fy.p,(MFIter *)&fx);
          amrex::EBDataCollection::getFaceCent((EBDataCollection *)pFVar10[0x1b]._vptr_FabFactory);
          amrex::MultiCutFab::const_array
                    (&uc,(MultiCutFab *)CONCAT44(fy.jstride._4_4_,(int)fy.jstride),(MFIter *)&fx);
          amrex::EBDataCollection::getFaceCent((EBDataCollection *)pFVar10[0x1b]._vptr_FabFactory);
          amrex::MultiCutFab::const_array
                    (&vc,(MultiCutFab *)CONCAT44(fy.kstride._4_4_,(int)fy.kstride),(MFIter *)&fx);
          pMVar13 = amrex::EBDataCollection::getCentroid
                              ((EBDataCollection *)pFVar10[0x1b]._vptr_FabFactory);
          amrex::MultiCutFab::const_array(&wc,pMVar13,(MFIter *)&fx);
          pFVar14 = &amrex::EBDataCollection::getVolFrac
                               ((EBDataCollection *)pFVar10[0x1b]._vptr_FabFactory)->
                     super_FabArray<amrex::FArrayBox>;
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    ((Array4<const_double> *)&advc_arr,pFVar14,(MFIter *)&fx);
          apy.p = (double *)CONCAT44(apx.p._4_4_,(int)apx.p);
          apy.nstride._0_4_ = (uint)apx.nstride;
          apy.kstride._4_4_ = apx.kstride._4_4_;
          apy.kstride._0_4_ = (int)apx.kstride;
          apy.jstride._0_4_ = (int)apx.jstride;
          apy.jstride._4_4_ = apx.jstride._4_4_;
          iVar7 = std::__cxx11::string::compare(redistribution_type._M_dataplus._M_p);
          if (iVar7 == 0) {
            iVar7 = (int)apy.p + -3;
            iVar35 = 3;
            iVar8 = -3;
            uVar5 = ncomp;
LAB_0045e920:
            apy.p = (double *)CONCAT44(apy.p._4_4_ + iVar8,iVar7);
            apy.jstride._0_4_ = (int)apy.jstride + iVar8;
            apy.jstride._4_4_ = apy.jstride._4_4_ + iVar35;
            apy.kstride._0_4_ = (int)apy.kstride + iVar35;
            apy.kstride._4_4_ = apy.kstride._4_4_ + iVar35;
          }
          else {
            iVar7 = std::__cxx11::string::compare(redistribution_type._M_dataplus._M_p);
            uVar5 = ncomp;
            if (iVar7 == 0) {
              iVar7 = (int)apy.p + -2;
              iVar35 = 2;
              iVar8 = -2;
              goto LAB_0045e920;
            }
          }
          amrex::FArrayBox::FArrayBox((FArrayBox *)&fy,(Box *)&apy,iVar18,true,false,(Arena *)0x0);
          arena = (Arena *)CONCAT44(fy.jstride._4_4_,(int)fy.jstride);
          if (arena == (Arena *)0x0) {
            arena = amrex::The_Arena();
          }
          amrex::Gpu::Elixir::Elixir((Elixir *)&apz,(void *)0x0,arena);
          iVar35 = fy.begin.x;
          iVar7 = fy.nstride._4_4_;
          uVar19 = (uint)fy.nstride;
          lVar23 = (long)fy.begin.z;
          result._8_8_ = ((long)fy.begin.y - (long)(int)(uint)fy.nstride) + 1;
          local_a5c = fy.begin.y + 1;
          result.bigend.vect._4_8_ = ((lVar23 + 1) - (long)fy.nstride._4_4_) * result._8_8_;
          result.smallend.vect[0] = (int)fy.kstride;
          result.smallend.vect[1] = fy.kstride._4_4_;
          result.btype.itype =
               (uint)((((long)fy.end.x + 1) - (long)fy.begin.x) * result.bigend.vect._4_8_);
          iVar26 = (int)((long)fy.end.x + 1);
          iVar8 = std::__cxx11::string::compare(redistribution_type._M_dataplus._M_p);
          auVar4 = _DAT_0077bb40;
          auVar3 = _DAT_0077bb30;
          if ((iVar8 == 0) && (iVar35 < iVar26)) {
            iStack_a58 = (int)(lVar23 + 1);
            uVar20 = ~uVar19 + local_a5c;
            auVar34._4_4_ = 0;
            auVar34._0_4_ = uVar20;
            auVar34._8_4_ = uVar20;
            auVar34._12_4_ = 0;
            auVar34 = auVar34 ^ _DAT_0077bb40;
            iVar8 = iVar35;
            do {
              if (iVar7 < iStack_a58) {
                lVar23 = ((long)iVar8 - (long)iVar35) * result.bigend.vect._4_8_ * 8 +
                         CONCAT44(result.smallend.vect[1],result.smallend.vect[0]) + 8;
                iVar29 = iVar7;
                do {
                  if ((int)uVar19 < local_a5c) {
                    uVar30 = 0;
                    do {
                      auVar38._8_4_ = (int)uVar30;
                      auVar38._0_8_ = uVar30;
                      auVar38._12_4_ = (int)(uVar30 >> 0x20);
                      auVar39 = (auVar38 | auVar3) ^ auVar4;
                      bVar33 = auVar34._0_4_ < auVar39._0_4_;
                      iVar36 = auVar34._4_4_;
                      iVar40 = auVar39._4_4_;
                      if ((bool)(~(iVar36 < iVar40 || iVar40 == iVar36 && bVar33) & 1)) {
                        *(undefined8 *)(lVar23 + -8 + uVar30 * 8) = 0x3ff0000000000000;
                      }
                      if (iVar36 >= iVar40 && (iVar40 != iVar36 || !bVar33)) {
                        *(undefined8 *)(lVar23 + uVar30 * 8) = 0x3ff0000000000000;
                      }
                      uVar30 = uVar30 + 2;
                    } while (((ulong)uVar20 + 2 & 0x1fffffffe) != uVar30);
                  }
                  iVar29 = iVar29 + 1;
                  lVar23 = lVar23 + result._8_8_ * 8;
                } while (iStack_a58 != iVar29);
              }
              bVar33 = iVar8 != iVar26 + -1;
              iVar8 = iVar8 + 1;
            } while (bVar33);
          }
          fcy.begin.y = fy.nstride._4_4_;
          fcy.begin.x = (uint)fy.nstride;
          fcy.jstride = ((long)fy.begin.y - (long)(int)(uint)fy.nstride) + 1;
          fcy.kstride = (((long)fy.begin.z + 1) - (long)fy.nstride._4_4_) * fcy.jstride;
          fcy.nstride = (((long)fy.end.x + 1) - (long)fy.begin.x) * fcy.kstride;
          fcy.end._0_8_ = (long)fy.begin.y + 1U & 0xffffffff | (long)fy.begin.z + 1 << 0x20;
          fcy.p = (double *)(fcy.nstride * lVar9 * 8 + CONCAT44(fy.kstride._4_4_,(int)fy.kstride));
          fcy.begin.z = fy.begin.x;
          fcy.end.z = (int)((long)fy.end.x + 1);
          fcy.ncomp = fy.end.z - uVar5;
          ncomp = uVar5;
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)&fcz,&advc.super_FabArray<amrex::FArrayBox>,(MFIter *)&fx);
          amrex::FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&ccc,local_ab0,(MFIter *)&fx,0);
          local_650[0] = local_640;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_650,*(long *)redistribution_type._M_dataplus._M_p,
                     *(long *)(redistribution_type._M_dataplus._M_p + 8) +
                     *(long *)redistribution_type._M_dataplus._M_p);
          vfrac.kstride = 0;
          vfrac.nstride = 0;
          vfrac.p = (double *)0x0;
          vfrac.jstride = 0;
          vfrac.begin.x = 1;
          vfrac.begin.y = 1;
          vfrac.begin.z = 1;
          vfrac.end.x = 0;
          vfrac.end.y = 0;
          vfrac.end.z = 0;
          vfrac.ncomp = 0;
          redistribution_type_00._M_string_length._0_1_ = 2;
          redistribution_type_00._M_dataplus._M_p = (pointer)local_650;
          redistribution_type_00._M_string_length._1_7_ = 0;
          redistribution_type_00.field_2._M_local_buf[0] = (char)&vfrac;
          redistribution_type_00.field_2._M_allocated_capacity._1_7_ = (int7)((ulong)&vfrac >> 8);
          redistribution_type_00.field_2._8_4_ = ncomp;
          redistribution_type_00.field_2._12_4_ = in_register_00000014;
          Redistribution::Apply
                    ((Box *)&apx,uVar5,(Array4<double> *)&fcy,(Array4<double> *)&fcz,&ccc,
                     (Array4<double> *)&result,(Array4<const_amrex::EBCellFlag> *)&fz,
                     (Array4<const_double> *)&xed,(Array4<const_double> *)&yed,
                     (Array4<const_double> *)&zed,(Array4<const_double> *)&advc_arr,&fcx_1,&uc,&vc,
                     &wc,d_bcrec_ptr,geom,dt,redistribution_type_00,(int)in_stack_fffffffffffff4a0,
                     0.5,in_stack_fffffffffffff4a8);
          if (local_650[0] != local_640) {
            operator_delete(local_650[0],local_640[0] + 1);
          }
          amrex::FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                    ((Array4<double> *)&fcz,&aofs->super_FabArray<amrex::FArrayBox>,(MFIter *)&fx,
                     aofs_comp);
          if (0 < (int)uVar5) {
            lVar23 = (long)apx.p._4_4_;
            in_stack_fffffffffffff4a0 =
                 (lVar23 - fcz.begin.y) * fcz.jstride * 8 + (long)(int)apx.p * 8 +
                 (long)fcz.begin.x * -8 + (long)fcz.p;
            lVar27 = (lVar23 - fcy.begin.y) * fcy.jstride * 8 + (long)(int)apx.p * 8 +
                     (long)fcy.begin.x * -8 + (long)fcy.p;
            in_stack_fffffffffffff4a8 = (Array4<const_double> *)(fcy.kstride * 8);
            uVar30 = 0;
            do {
              iVar7 = (int)apx.jstride;
              if ((int)apx.jstride <= apx.kstride._4_4_) {
                do {
                  if (apx.p._4_4_ <= (int)apx.kstride) {
                    lVar25 = ((long)iVar7 - (long)fcz.begin.z) * fcz.kstride * 8 +
                             in_stack_fffffffffffff4a0;
                    lVar22 = ((long)iVar7 - (long)fcy.begin.z) * (long)in_stack_fffffffffffff4a8 +
                             lVar27;
                    lVar28 = lVar23;
                    do {
                      if ((int)apx.p <= apx.jstride._4_4_) {
                        lVar32 = 0;
                        do {
                          *(double *)(lVar25 + lVar32 * 8) =
                               *(double *)(lVar25 + lVar32 * 8) - *(double *)(lVar22 + lVar32 * 8);
                          lVar32 = lVar32 + 1;
                        } while ((apx.jstride._4_4_ - (int)apx.p) + 1 != (int)lVar32);
                      }
                      lVar28 = lVar28 + 1;
                      lVar25 = lVar25 + fcz.jstride * 8;
                      lVar22 = lVar22 + fcy.jstride * 8;
                    } while ((int)apx.kstride + 1 != (int)lVar28);
                  }
                  bVar33 = iVar7 != apx.kstride._4_4_;
                  iVar7 = iVar7 + 1;
                } while (bVar33);
              }
              uVar30 = uVar30 + 1;
              in_stack_fffffffffffff4a0 = in_stack_fffffffffffff4a0 + fcz.nstride * 8;
              lVar27 = lVar27 + fcy.nstride * 8;
            } while (uVar30 != uVar11);
          }
          amrex::Gpu::Elixir::~Elixir((Elixir *)&apz);
          fy.p = (double *)&PTR__BaseFab_00837b90;
          amrex::BaseFab<double>::clear((BaseFab<double> *)&fy);
        }
      }
      amrex::MFIter::operator++((MFIter *)&fx);
    } while (fx.begin.x < fx.begin.z);
  }
  amrex::MFIter::~MFIter((MFIter *)&fx);
  amrex::MultiFab::~MultiFab(&sstate_tmp);
  amrex::MultiFab::~MultiFab(&advc);
  return;
}

Assistant:

void
EBMOL::ComputeSyncAofs ( MultiFab& aofs, int aofs_comp, int ncomp,
                         MultiFab const& state, int state_comp,
                         AMREX_D_DECL( MultiFab const& umac,
                                       MultiFab const& vmac,
                                       MultiFab const& wmac),
                         AMREX_D_DECL( MultiFab const& ucorr,
                                       MultiFab const& vcorr,
                                       MultiFab const& wcorr),
                         AMREX_D_DECL( MultiFab& xedge,
                                       MultiFab& yedge,
                                       MultiFab& zedge),
                         int  edge_comp,
                         bool known_edgestate,
                         AMREX_D_DECL( MultiFab& xfluxes,
                                       MultiFab& yfluxes,
                                       MultiFab& zfluxes),
                         int fluxes_comp,
                         Vector<BCRec> const& bcs,
                         BCRec  const* d_bcrec_ptr,
                         Geometry const&  geom,
                         const Real dt,
                         const bool is_velocity,
                         std::string redistribution_type )
{
    BL_PROFILE("EBMOL::ComputeSyncAofs()");

    bool fluxes_are_area_weighted = true;

    AMREX_ALWAYS_ASSERT(state.nComp() >= state_comp + ncomp);
    AMREX_ALWAYS_ASSERT(aofs.nComp()  >= aofs_comp  + ncomp);
    AMREX_D_TERM( AMREX_ALWAYS_ASSERT(xedge.nComp() >= edge_comp  + ncomp);,
                  AMREX_ALWAYS_ASSERT(yedge.nComp() >= edge_comp  + ncomp);,
                  AMREX_ALWAYS_ASSERT(zedge.nComp() >= edge_comp  + ncomp););
    AMREX_D_TERM( AMREX_ALWAYS_ASSERT(xfluxes.nComp() >= fluxes_comp  + ncomp);,
                  AMREX_ALWAYS_ASSERT(yfluxes.nComp() >= fluxes_comp  + ncomp);,
                  AMREX_ALWAYS_ASSERT(zfluxes.nComp() >= fluxes_comp  + ncomp););
    AMREX_D_TERM( AMREX_ALWAYS_ASSERT(xfluxes.nGrow() == xedge.nGrow());,
                  AMREX_ALWAYS_ASSERT(yfluxes.nGrow() == yedge.nGrow());,
                  AMREX_ALWAYS_ASSERT(zfluxes.nGrow() == zedge.nGrow()););


    // To compute edge states, need at least 2 ghost cells in state
    if ( !known_edgestate )
        AMREX_ALWAYS_ASSERT(state.nGrow() >= 2);

    AMREX_ALWAYS_ASSERT(state.hasEBFabFactory());
    auto const& ebfactory = dynamic_cast<EBFArrayBoxFactory const&>(state.Factory());

    // Need 2 grow cells in state to compute the slopes needed to compute the edge state.
    int halo = known_edgestate ? 0 : 2;

    // Create temporary holder for advection term. Needed to fill ghost cells.
    MultiFab advc(state.boxArray(),state.DistributionMap(),ncomp,3,MFInfo(),ebfactory);
    advc.setVal(0.);

    Box  const& domain = geom.Domain();
    MFItInfo mfi_info;

    if (Gpu::notInLaunchRegion()) mfi_info.EnableTiling().SetDynamic(true);
#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(aofs,mfi_info); mfi.isValid(); ++mfi)
    {
        auto const& bx = mfi.tilebox();
    AMREX_D_TERM( const Box& xbx = mfi.nodaltilebox(0);,
                      const Box& ybx = mfi.nodaltilebox(1);,
                      const Box& zbx = mfi.nodaltilebox(2); );

        AMREX_D_TERM( Array4<Real> fx = xfluxes.array(mfi,fluxes_comp);,
                      Array4<Real> fy = yfluxes.array(mfi,fluxes_comp);,
                      Array4<Real> fz = zfluxes.array(mfi,fluxes_comp););

    AMREX_D_TERM( Array4<Real> xed = xedge.array(mfi,edge_comp);,
                      Array4<Real> yed = yedge.array(mfi,edge_comp);,
                      Array4<Real> zed = zedge.array(mfi,edge_comp););

        // Initialize covered cells
        auto const& flagfab = ebfactory.getMultiEBCellFlagFab()[mfi];
        auto const& flag    = flagfab.const_array();

        if (flagfab.getType(bx) == FabType::covered)
        {
            auto const& aofs_arr = aofs.array(mfi, aofs_comp);

            amrex::ParallelFor(
                bx, ncomp, [aofs_arr] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { aofs_arr( i, j, k, n ) = covered_val;},

                xbx, ncomp, [fx,xed] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { fx( i, j, k, n ) = 0.0; xed( i, j, k, n ) = covered_val;},

                ybx, ncomp, [fy,yed] AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { fy( i, j, k, n ) = 0.0; yed( i, j, k, n ) = covered_val;});

#if (AMREX_SPACEDIM==3)
            amrex::ParallelFor(
                zbx, ncomp, [fz,zed]AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
                { fz( i, j, k, n ) = 0.0; zed( i, j, k, n ) = covered_val;});
#endif
        }
        else
        {
            AMREX_D_TERM( Array4<Real const> uc = ucorr.const_array(mfi);,
                          Array4<Real const> vc = vcorr.const_array(mfi);,
                          Array4<Real const> wc = wcorr.const_array(mfi););

        Array4<Real> advc_arr = advc.array(mfi);

            bool regular = flagfab.getType(amrex::grow(bx,halo)) == FabType::regular;

            if (!regular)
            {
                AMREX_D_TERM( Array4<Real const> fcx = ebfactory.getFaceCent()[0]->const_array(mfi);,
                              Array4<Real const> fcy = ebfactory.getFaceCent()[1]->const_array(mfi);,
                              Array4<Real const> fcz = ebfactory.getFaceCent()[2]->const_array(mfi););

                Array4<Real const> ccc = ebfactory.getCentroid().const_array(mfi);

                auto vfrac = ebfactory.getVolFrac().const_array(mfi);

                AMREX_D_TERM( auto apx = ebfactory.getAreaFrac()[0]->const_array(mfi);,
                              auto apy = ebfactory.getAreaFrac()[1]->const_array(mfi);,
                              auto apz = ebfactory.getAreaFrac()[2]->const_array(mfi); );

                // Compute edge state if needed
                if (!known_edgestate)
                {
            Array4<Real const> const q = state.const_array(mfi,state_comp);

            AMREX_D_TERM( Array4<Real const> u = umac.const_array(mfi);,
                                  Array4<Real const> v = vmac.const_array(mfi);,
                                  Array4<Real const> w = wmac.const_array(mfi););

                    EBMOL::ComputeEdgeState( bx,
                                             AMREX_D_DECL(xed,yed,zed),
                                             q, ncomp,
                                             AMREX_D_DECL(u,v,w),
                                             domain, bcs, d_bcrec_ptr,
                                             AMREX_D_DECL(fcx,fcy,fcz),
                                             ccc, vfrac, flag,
                                             is_velocity );
                }

                // Compute fluxes
                HydroUtils::EB_ComputeFluxes(bx,
                                             AMREX_D_DECL(fx,fy,fz),
                                             AMREX_D_DECL(uc,vc,wc),
                                             AMREX_D_DECL(xed,yed,zed),
                                             AMREX_D_DECL(apx,apy,apz),
                                             geom, ncomp, flag, fluxes_are_area_weighted  );

                // Compute divergence
        // Compute -div because that's what redistribution needs
                Real mult = -1.0;
                HydroUtils::EB_ComputeDivergence(bx, advc_arr,
                                                 AMREX_D_DECL(fx,fy,fz), vfrac,
                                                 ncomp, geom, mult, fluxes_are_area_weighted  );
            }
            else
            {
                // Compute edge state if needed
                if (!known_edgestate)
                {
            Array4<Real const> const q = state.const_array(mfi,state_comp);

            AMREX_D_TERM( Array4<Real const> u = umac.const_array(mfi);,
                                  Array4<Real const> v = vmac.const_array(mfi);,
                                  Array4<Real const> w = wmac.const_array(mfi););

                    MOL::ComputeEdgeState( bx,
                                           AMREX_D_DECL( xed, yed, zed ),
                                           q, ncomp,
                                           AMREX_D_DECL( u, v, w ),
                                           domain, bcs, d_bcrec_ptr,
                                           is_velocity);

                }

                // Compute fluxes
                HydroUtils::ComputeFluxes(bx,
                                          AMREX_D_DECL(fx,fy,fz),
                                          AMREX_D_DECL(uc,vc,wc),
                                          AMREX_D_DECL(xed,yed,zed),
                                          geom, ncomp, fluxes_are_area_weighted  );

                // Compute divergence
                // We use minus sign, i.e. -div, for consistency with EB above
                Real mult = -1.0;
                HydroUtils::ComputeDivergence(bx, advc_arr,
                                              AMREX_D_DECL(fx,fy,fz),
                                              ncomp, geom,
                                              mult, fluxes_are_area_weighted );
            }
    }
    }

    advc.FillBoundary(geom.periodicity());

    MultiFab sstate_tmp;
    MultiFab* sstate;
    if (redistribution_type == "StateRedist")
    {
      // Create temporary holder for sync "state" passed in via aofs
      // Do this so we're not overwriting the "state" as we go through the redistribution
      // process.
      sstate_tmp.define(state.boxArray(),state.DistributionMap(),ncomp,state.nGrow(),
                        MFInfo(),ebfactory);
      sstate = &sstate_tmp;
      MultiFab::Copy(*sstate,aofs,aofs_comp,0,ncomp,state.nGrow());
    }
    else
    {
      // Doesn't matter what we put here, sstate only gets used for StateRedist
      sstate = &aofs;
    }

    if (Gpu::notInLaunchRegion())  mfi_info.EnableTiling().SetDynamic(true);
#ifdef _OPENMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
    for (MFIter mfi(aofs,mfi_info); mfi.isValid(); ++mfi)
    {
        auto const& bx = mfi.tilebox();

        auto const& flagfab = ebfactory.getMultiEBCellFlagFab()[mfi];
        auto const& flag    = flagfab.const_array();

        if (flagfab.getType(bx) != FabType::covered)
    {
      // FIXME? not sure if 4 is really needed or if 3 could do
      // But this is a safe choice
      if (flagfab.getType(grow(bx,4)) != FabType::regular)
      {
        //
        // Redistribute
        //
        AMREX_D_TERM( auto apx = ebfactory.getAreaFrac()[0]->const_array(mfi);,
              auto apy = ebfactory.getAreaFrac()[1]->const_array(mfi);,
              auto apz = ebfactory.getAreaFrac()[2]->const_array(mfi); );

        AMREX_D_TERM( Array4<Real const> fcx = ebfactory.getFaceCent()[0]->const_array(mfi);,
              Array4<Real const> fcy = ebfactory.getFaceCent()[1]->const_array(mfi);,
              Array4<Real const> fcz = ebfactory.getFaceCent()[2]->const_array(mfi););

        Array4<Real const> ccc = ebfactory.getCentroid().const_array(mfi);
        auto vfrac = ebfactory.getVolFrac().const_array(mfi);

        // This is scratch space if calling StateRedistribute,
            //  but is used as the weights (here set to 1) if calling
            //  FluxRedistribute
        Box gbx = bx;

        if (redistribution_type == "StateRedist")
          gbx.grow(3);
        else if (redistribution_type == "FluxRedist")
          gbx.grow(2);
        FArrayBox tmpfab(gbx, ncomp*2);
        Elixir eli = tmpfab.elixir();
        Array4<Real> scratch = tmpfab.array(0);
        if (redistribution_type == "FluxRedist")
        {
          amrex::ParallelFor(Box(scratch),
              [=] AMREX_GPU_DEVICE (int i, int j, int k) noexcept
              { scratch(i,j,k) = 1.;});
        }
        Array4<Real> divtmp_redist_arr = tmpfab.array(ncomp);

        // Redistribute
        //
        // For StateRedistribution, we use the Sync as the "state".
        // This may lead to oversmoothing.
        //
        Redistribution::Apply( bx, ncomp,  divtmp_redist_arr, advc.array(mfi),
                   sstate->const_array(mfi, 0), scratch, flag,
                   AMREX_D_DECL(apx,apy,apz), vfrac,
                   AMREX_D_DECL(fcx,fcy,fcz), ccc, d_bcrec_ptr,
                   geom, dt, redistribution_type );

        // Subtract contribution to sync aofs -- sign of divergence in aofs is opposite
        // of sign of div as computed by EB_ComputeDivergence, thus it must be subtracted.
        auto const& aofs_arr = aofs.array(mfi, aofs_comp);

        amrex::ParallelFor(bx, ncomp, [aofs_arr, divtmp_redist_arr]
        AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
            { aofs_arr( i, j, k, n ) -=  divtmp_redist_arr( i, j, k, n ); });
      }
      else
      {
        // Subtract contribution to sync aofs -- sign of divergence in aofs is opposite
        // of sign of div as computed here, and thus it must be subtracted.
        auto const& aofs_arr = aofs.array(mfi, aofs_comp);
        Array4<Real> advc_arr = advc.array(mfi);

        amrex::ParallelFor(bx, ncomp, [aofs_arr, advc_arr]
            AMREX_GPU_DEVICE (int i, int j, int k, int n) noexcept
            { aofs_arr( i, j, k, n ) -= advc_arr( i, j, k, n ); });
      }
    }
    }
}